

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O1

void emitError(StringRef filename,StringRef message,char *position,uint length,int line,int column,
              StringRef buffer)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  long *local_68;
  long local_60;
  long local_58 [2];
  char *local_48;
  size_t local_40;
  char *local_38;
  
  local_40 = message.Length;
  local_48 = message.Data;
  if ((position < buffer.Data) || (local_38 = buffer.Data + buffer.Length, local_38 < position)) {
    __assert_fail("position >= buffer.begin() && position <= buffer.end() && \"invalid position\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandUtil.cpp"
                  ,0x4b,
                  "void emitError(StringRef, StringRef, const char *, unsigned int, int, int, StringRef)"
                 );
  }
  if (local_38 < position + length) {
    __assert_fail("position + length <= buffer.end() && \"invalid length\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandUtil.cpp"
                  ,0x4c,
                  "void emitError(StringRef, StringRef, const char *, unsigned int, int, int, StringRef)"
                 );
  }
  if (line == -1) {
    if (buffer.Data == position) {
      line = 1;
      column = 0;
    }
    else {
      line = 1;
      column = 0;
      pcVar5 = buffer.Data;
      do {
        column = column + 1;
        if (*pcVar5 == '\n') {
          column = 0;
        }
        line = line + (uint)(*pcVar5 == '\n');
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != position);
    }
  }
  std::ostream::write((char *)&std::cerr,(long)filename.Data);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,column);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
  std::ostream::write((char *)&std::cerr,(long)local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  if (local_38 != position) {
    lVar1 = 0;
    do {
      lVar6 = lVar1;
      if ((position + lVar6 <= buffer.Data) || (position[lVar6 + -1] == '\r')) break;
      lVar1 = lVar6 + -1;
    } while (position[lVar6 + -1] != '\n');
    pcVar5 = position;
    if (position < local_38) {
      do {
        if ((*pcVar5 == '\n') || (*pcVar5 == '\r')) break;
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 < local_38);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,position + lVar6,pcVar5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_68,local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
    for (; lVar6 != 0; lVar6 = lVar6 + 1) {
      cVar4 = position[lVar6];
      iVar2 = isspace((int)cVar4);
      if (iVar2 == 0) {
        cVar4 = ' ';
      }
      local_68 = (long *)CONCAT71(local_68._1_7_,cVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_68,1);
    }
    if (length < 2) {
      local_68._1_7_ = (undefined7)((ulong)local_68 >> 8);
      local_68 = (long *)CONCAT71(local_68._1_7_,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_68,1);
    }
    else {
      do {
        local_68 = (long *)CONCAT71(local_68._1_7_,0x7e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)&local_68,1);
        length = length - 1;
      } while (length != 0);
    }
    local_68 = (long *)CONCAT71(local_68._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_68,1);
  }
  return;
}

Assistant:

static void emitError(StringRef filename, StringRef message,
                      const char* position, unsigned length,
                      int line, int column,
                      StringRef buffer) {
  assert(position >= buffer.begin() && position <= buffer.end() &&
         "invalid position");
  assert(position + length <= buffer.end() && "invalid length");

  // Compute the line and column, if not provided.
  //
  // FIXME: This is not very efficient, if there are a lot of diagnostics.
  if (line == -1) {
    line = 1;
    column = 0;
    for (const char *c = buffer.begin(); c != position; ++c) {
      if (*c == '\n') {
        ++line;
        column = 0;
      } else {
        ++column;
      }
    }
  }

  std::cerr.write(filename.data(), filename.size());
  std::cerr << ":" << line << ":" << column << ": error: ";
  std::cerr.write(message.data(), message.size());
  std::cerr << "\n";

  // Skip carat diagnostics on EOF token.
  if (position == buffer.end())
    return;

  // Simple caret style diagnostics.
  const char *lineBegin = position, *lineEnd = position;
  const char *bufferBegin = buffer.begin(), *bufferEnd = buffer.end();

  // Run line pointers forward and back.
  while (lineBegin > bufferBegin &&
         lineBegin[-1] != '\r' && lineBegin[-1] != '\n')
    --lineBegin;
  while (lineEnd < bufferEnd &&
         lineEnd[0] != '\r' && lineEnd[0] != '\n')
    ++lineEnd;

  // Show the line, indented by 2.
  std::cerr << "  " << std::string(lineBegin, lineEnd) << "\n";

  // Show the caret or squiggly, making sure to print back spaces the same.
  std::cerr << "  ";
  for (const char* s = lineBegin; s != position; ++s)
    std::cerr << (isspace(*s) ? *s : ' ');
  if (length > 1) {
    for (unsigned i = 0; i != length; ++i)
      std::cerr << '~';
  } else {
    std::cerr << '^';
  }
  std::cerr << '\n';
}